

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

int __thiscall Jupiter::Timer::kill(Timer *this,__pid_t __pid,int __sig)

{
  bool bVar1;
  undefined7 extraout_var;
  
  bVar1 = removeFromList(this);
  (*(this->super_Thinker)._vptr_Thinker[2])(this);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool Jupiter::Timer::kill()
{
	if (this->removeFromList())
	{
		delete this;
		return true;
	}

	delete this;
	return false;
}